

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

int __thiscall
glslang::TDefaultGlslIoResolver::resolveBinding
          (TDefaultGlslIoResolver *this,EShLanguage stage,TVarEntryInfo *ent)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  SpvVersion *pSVar4;
  ulong uVar5;
  TQualifier *this_00;
  long lVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  mapped_type *pmVar9;
  int local_78;
  int local_74;
  iterator iStack_60;
  int binding;
  _Self local_58;
  iterator iter;
  int iStack_48;
  bool hasBinding;
  int newBinding;
  int resourceKey;
  int set;
  TResourceType resource;
  int numBindings;
  TString *name;
  TType *type;
  TVarEntryInfo *ent_local;
  TDefaultGlslIoResolver *pTStack_18;
  EShLanguage stage_local;
  TDefaultGlslIoResolver *this_local;
  
  type = (TType *)ent;
  ent_local._4_4_ = stage;
  pTStack_18 = this;
  iVar2 = (*(ent->symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  name = (TString *)CONCAT44(extraout_var,iVar2);
  _resource = (key_type *)(**(code **)(**(long **)&type->field_0x8 + 0x1a0))();
  pSVar4 = TIntermediate::getSpv((this->super_TDefaultIoResolverBase).referenceIntermediate);
  if ((pSVar4->openGl == 0) ||
     (uVar5 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[2].inUseList)(),
     (uVar5 & 1) == 0)) {
    local_74 = 1;
  }
  else {
    local_74 = (*(code *)(name->_M_dataplus).super_allocator_type.allocator[1].freeList)();
  }
  set = local_74;
  resourceKey = (*(this->super_TDefaultIoResolverBase).super_TIoMapResolver._vptr_TIoMapResolver
                  [0x15])(this,name);
  if ((resourceKey == 3) &&
     (iVar2 = (*(code *)(((name->_M_dataplus).super_allocator_type.allocator)->stack).
                        super__Vector_base<glslang::TPoolAllocator::tAllocState,_std::allocator<glslang::TPoolAllocator::tAllocState>_>
                        ._M_impl.super__Vector_impl_data._M_start)(), iVar2 != 0x10)) {
    *(undefined4 *)&(type->qualifier).field_0x8 = 0xffffffff;
    this_local._4_4_ = -1;
  }
  else {
    pSVar4 = TIntermediate::getSpv((this->super_TDefaultIoResolverBase).referenceIntermediate);
    if (pSVar4->openGl == 0) {
      local_78 = *(int *)&(type->qualifier).field_0xc;
    }
    else {
      local_78 = resourceKey;
    }
    newBinding = local_78;
    iStack_48 = local_78;
    if (resourceKey < 6) {
      this_00 = (TQualifier *)
                (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
      bVar1 = TQualifier::hasBinding(this_00);
      iVar2 = iStack_48;
      if (bVar1) {
        iVar3 = TDefaultIoResolverBase::getBaseBinding
                          (&this->super_TDefaultIoResolverBase,ent_local._4_4_,resourceKey,
                           newBinding);
        lVar6 = (*(code *)((name->_M_dataplus).super_allocator_type.allocator)->totalBytes)();
        this_local._4_4_ =
             TDefaultIoResolverBase::reserveSlot
                       (&this->super_TDefaultIoResolverBase,iVar2,
                        iVar3 + ((uint)((ulong)*(undefined8 *)(lVar6 + 0x1c) >> 0x20) & 0xffff),set)
        ;
        *(int *)&(type->qualifier).field_0x8 = this_local._4_4_;
      }
      else {
        iter._M_node._3_1_ = 0;
        *(undefined4 *)&(type->qualifier).field_0x8 = 0xffffffff;
        pmVar7 = std::
                 map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
                 ::operator[](&this->resourceSlotMap,&stack0xffffffffffffffb8);
        bVar1 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                ::empty(pmVar7);
        if (!bVar1) {
          pmVar7 = std::
                   map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
                   ::operator[](&this->resourceSlotMap,&stack0xffffffffffffffb8);
          local_58._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
               ::find(pmVar7,_resource);
          pmVar7 = std::
                   map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
                   ::operator[](&this->resourceSlotMap,&stack0xffffffffffffffb8);
          iStack_60 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                      ::end(pmVar7);
          bVar1 = std::operator!=(&local_58,&stack0xffffffffffffffa0);
          if (bVar1) {
            iter._M_node._3_1_ = 1;
            ppVar8 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>
                     ::operator->(&local_58);
            *(int *)&(type->qualifier).field_0x8 = ppVar8->second;
          }
        }
        if ((((iter._M_node._3_1_ & 1) == 0) && (((ulong)(type->qualifier).semanticName & 1) != 0))
           && (bVar1 = TDefaultIoResolverBase::doAutoBindingMapping
                                 (&this->super_TDefaultIoResolverBase), iVar2 = iStack_48, bVar1)) {
          iVar3 = TDefaultIoResolverBase::getBaseBinding
                            (&this->super_TDefaultIoResolverBase,ent_local._4_4_,resourceKey,
                             newBinding);
          iVar2 = TDefaultIoResolverBase::getFreeSlot
                            (&this->super_TDefaultIoResolverBase,iVar2,iVar3,set);
          pmVar7 = std::
                   map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>_>_>_>
                   ::operator[](&this->resourceSlotMap,&stack0xffffffffffffffb8);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int>_>_>
                   ::operator[](pmVar7,_resource);
          *pmVar9 = iVar2;
          *(int *)&(type->qualifier).field_0x8 = iVar2;
        }
        this_local._4_4_ = *(int *)&(type->qualifier).field_0x8;
      }
    }
    else {
      *(undefined4 *)&(type->qualifier).field_0x8 = 0xffffffff;
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int TDefaultGlslIoResolver::resolveBinding(EShLanguage stage, TVarEntryInfo& ent) {
    const TType& type = ent.symbol->getType();
    const TString& name = ent.symbol->getAccessName();
    // On OpenGL arrays of opaque types take a separate binding for each element
    int numBindings = referenceIntermediate.getSpv().openGl != 0 && type.isSizedArray() ? type.getCumulativeArraySize() : 1;
    TResourceType resource = getResourceType(type);
    // don't need to handle uniform symbol, it will be handled in resolveUniformLocation
    if (resource == EResUbo && type.getBasicType() != EbtBlock) {
        return ent.newBinding = -1;
    }
    // There is no 'set' qualifier in OpenGL shading language, each resource has its own
    // binding name space, so remap the 'set' to resource type which make each resource
    // binding is valid from 0 to MAX_XXRESOURCE_BINDINGS
    int set = referenceIntermediate.getSpv().openGl != 0 ? resource : ent.newSet;
    int resourceKey = set;
    if (resource < EResCount) {
        if (type.getQualifier().hasBinding()) {
            int newBinding = reserveSlot(resourceKey, getBaseBinding(stage, resource, set) + type.getQualifier().layoutBinding, numBindings);
            return ent.newBinding = newBinding;

        } else {
            // The resource in current stage is not declared with binding, but it is possible declared
            // with explicit binding in other stages, find the resourceSlotMap firstly to check whether
            // the resource has binding, don't need to allocate if it already has a binding
            bool hasBinding = false;
            ent.newBinding = -1; // leave as -1 if it isn't set below

            if (! resourceSlotMap[resourceKey].empty()) {
                TVarSlotMap::iterator iter = resourceSlotMap[resourceKey].find(name);
                if (iter != resourceSlotMap[resourceKey].end()) {
                    hasBinding = true;
                    ent.newBinding = iter->second;
                }
            }
            if (!hasBinding && (ent.live && doAutoBindingMapping())) {
                // find free slot, the caller did make sure it passes all vars with binding
                // first and now all are passed that do not have a binding and needs one
                int binding = getFreeSlot(resourceKey, getBaseBinding(stage, resource, set), numBindings);
                resourceSlotMap[resourceKey][name] = binding;
                ent.newBinding = binding;
            }
            return ent.newBinding;
        }
    }
    return ent.newBinding = -1;
}